

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTAircraft.cpp
# Opt level: O2

void __thiscall LTAircraft::LabelUpdate(LTAircraft *this)

{
  float *outColor;
  undefined8 uVar1;
  string local_30;
  
  LTFlightData::ComposeLabel_abi_cxx11_(&local_30,this->fd);
  std::__cxx11::string::operator=((string *)&(this->super_Aircraft).label,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  outColor = (this->super_Aircraft).colLabel;
  if (dataRefs.bLabelColDynamic == 0) {
    DataRefs::GetLabelColor(&dataRefs,outColor);
  }
  else {
    uVar1 = *(undefined8 *)(this->pMdl->LABEL_COLOR + 2);
    *(undefined8 *)outColor = *(undefined8 *)this->pMdl->LABEL_COLOR;
    *(undefined8 *)((this->super_Aircraft).colLabel + 2) = uVar1;
  }
  return;
}

Assistant:

void LTAircraft::LabelUpdate()
{
    label = fd.ComposeLabel();
    
    // color depends on setting and maybe model
    if (dataRefs.IsLabelColorDynamic())
        memmove(colLabel, pMdl->LABEL_COLOR, sizeof(colLabel));
    else
        dataRefs.GetLabelColor(colLabel);
}